

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherType_TestShell::
TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherType_TestShell
          (TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherType_TestShell *this)

{
  TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherType_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &PTR__TEST_MemoryLeakDetectorTest_AllocOneTypeFreeAnotherType_TestShell_003e4ed8;
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, AllocOneTypeFreeAnotherType)
{
    char* mem = detector->allocMemory(defaultNewArrayAllocator(), 100, "ALLOC.c", 10);
    detector->deallocMemory(defaultMallocAllocator(), mem, "FREE.c", 100);
    detector->stopChecking();
    CHECK(reporter->message->contains("Allocation/deallocation type mismatch"));
    CHECK(reporter->message->contains("   allocated at file: ALLOC.c line: 10 size: 100 type: new []"));
    CHECK(reporter->message->contains("   deallocated at file: FREE.c line: 100 type: free"));
}